

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O0

void __thiscall lsim::ModelCircuit::sync_sub_circuit_components(ModelCircuit *this)

{
  bool bVar1;
  reference puVar2;
  ModelComponent *this_00;
  ModelComponent *comp;
  iterator iStack_40;
  uint id;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  ModelCircuit *this_local;
  
  component_ids_of_type((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1,this,0x301)
  ;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1);
  iStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    this_00 = component_by_id(this,*puVar2);
    ModelComponent::sync_nested_circuit(this_00,this->m_context);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1);
  return;
}

Assistant:

void ModelCircuit::sync_sub_circuit_components() {
    for (auto id : component_ids_of_type(COMPONENT_SUB_CIRCUIT)) {
        auto comp = component_by_id(id);
        comp->sync_nested_circuit(m_context);
    }
}